

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextAutomata.h
# Opt level: O2

uint __thiscall
bwtil::ContextAutomata::optimalK
          (ContextAutomata *this,uint overhead,BackwardIterator *bfr,bool verbose)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint uVar5;
  time_t tVar6;
  ulong uVar7;
  ulong uVar8;
  ostream *poVar9;
  ulint uVar10;
  ulint uVar11;
  undefined4 uVar12;
  undefined7 in_register_00000009;
  undefined8 uVar13;
  undefined4 uVar15;
  ulint uVar14;
  uint i;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  allocator_type local_169;
  long local_168;
  double local_160;
  double local_158;
  ulong local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampled_text;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  value_type local_100;
  PartialSums sample_cumulative_counter;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> sample_dynstring;
  undefined1 extraout_var [56];
  
  auVar22 = in_ZMM1._0_16_;
  local_150 = CONCAT44(local_150._4_4_,overhead);
  sampled_text.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sampled_text.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar20 = 1000;
  if (this->n < 1000) {
    uVar20 = this->n;
  }
  sampled_text.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar13 = CONCAT71(in_register_00000009,verbose);
  tVar6 = time((time_t *)0x0);
  uVar15 = (undefined4)((ulong)uVar13 >> 0x20);
  srand((uint)tVar6);
  uVar19 = this->n;
  uVar7 = uVar19 / uVar20;
  auVar2 = vcvtusi2sd_avx512f(auVar22,uVar19);
  auVar21._0_8_ = log2(auVar2._0_8_);
  auVar21._8_56_ = extraout_var;
  uVar12 = vcvttsd2usi_avx512f(auVar21._0_16_);
  uVar8 = uVar19 / CONCAT44(uVar15,uVar12);
  if ((int)CONCAT71(in_register_00000009,verbose) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"  Sampling text ... ");
    std::endl<char,std::char_traits<char>>(poVar9);
    uVar19 = this->n;
  }
  auVar2 = vcvtusi2sd_avx512f(auVar22,uVar8 / uVar20);
  auVar22 = vcvtusi2sd_avx512f(auVar22,uVar7);
  local_160 = auVar2._0_8_ / auVar22._0_8_;
  local_168 = CONCAT44(local_168._4_4_,0xffffffff);
  while (iVar4 = (*bfr->_vptr_BackwardIterator[4])(bfr), (char)iVar4 == '\0') {
    if ((this->n - uVar19) % uVar20 == 0) {
      if ((uVar20 <= uVar19) && ((this->n == uVar19 || (bVar3 = flip_coin(this,local_160), bVar3))))
      {
        for (uVar16 = 0; uVar16 < (uint)uVar20; uVar16 = uVar16 + 1) {
          iVar4 = (*bfr->_vptr_BackwardIterator[3])(bfr);
          sample_dynstring.number_of_internal_nodes = (symbol)iVar4;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&sampled_text,&sample_dynstring.number_of_internal_nodes);
        }
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->n;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (this->n - uVar19) * 100;
      iVar4 = SUB164(auVar1 / auVar2,0);
      if (((int)local_168 < iVar4 && verbose) &&
          (int)((SUB168(auVar1 / auVar2,0) & 0xffffffff) % 5) == 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"  ");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar4);
        poVar9 = std::operator<<(poVar9,"% done.");
        std::endl<char,std::char_traits<char>>(poVar9);
        local_168 = CONCAT44(local_168._4_4_,iVar4);
      }
    }
    uVar19 = uVar19 - 1;
    (*bfr->_vptr_BackwardIterator[3])(bfr);
  }
  (*bfr->_vptr_BackwardIterator[2])(bfr);
  if (verbose) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n  Sampled text size = ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  PartialSums::PartialSums(&sample_cumulative_counter,this->sigma,this->n);
  local_100 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_118,(ulong)this->sigma,
             &local_100,&local_169);
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::DynamicString
            (&sample_dynstring,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_118);
  uVar10 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::bitSize
                     (&sample_dynstring);
  local_168 = uVar10 + 0x1a0 + (ulong)sample_cumulative_counter.nr_of_nodes * 0x40;
  auVar22 = vcvtusi2sd_avx512f(in_XMM2,this->n + 1);
  local_160 = (double)((ulong)(this->sigma << 3) * 4 + 0xc0);
  local_158 = log2(auVar22._0_8_);
  if (verbose) {
    poVar9 = std::operator<<((ostream *)&std::cout,"  Extimated number of bits per k-mer: ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    poVar9 = std::operator<<((ostream *)&std::cout,"  Extimated number of bits per (k-1)-mer: ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_130,&sampled_text);
  uVar16 = 1;
  uVar10 = numberOfContexts(this,1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &local_130);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_130);
  if (verbose) {
    poVar9 = std::operator<<((ostream *)&std::cout,"  Number of ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9,"-mers : ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_158;
  uVar5 = vcvttsd2usi_avx512f(auVar22);
  local_150 = local_150 & 0xffffffff;
  local_158 = (double)(ulong)(uVar5 + (uVar5 == 0));
  uVar14 = 1;
  for (lVar18 = 2; lVar18 - 1U < (ulong)uVar5; lVar18 = lVar18 + 1) {
    if ((this->n * local_150) / 100 < uVar14 * (long)local_160 + uVar10 * local_168)
    goto LAB_00110f9f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0,&sampled_text);
    uVar11 = numberOfContexts(this,(uint)lVar18,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d0);
    if (verbose) {
      poVar9 = std::operator<<((ostream *)&std::cout,"  Number of ");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,"-mers : ");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    uVar16 = uVar16 + 1;
    uVar14 = uVar10;
    uVar10 = uVar11;
  }
  uVar16 = SUB84(local_158,0);
LAB_00110f9f:
  uVar17 = 1;
  if (1 < uVar16) {
    uVar17 = uVar16 - 1;
  }
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::~DynamicString
            (&sample_dynstring);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sample_cumulative_counter.nodes.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sampled_text.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar17;
}

Assistant:

uint optimalK(uint overhead, BackwardIterator * bfr, bool verbose){

		//strategy: sample randomly n/log n characters of the text (in contiguous blocks of size B)
		//and try k=1,... until suitable k is found. There will be at most log_sigma n iterations, so work is linear.

		ulint B = 1000; //number of characters per block

		if(n<B)
			B = n;

		vector<symbol> sampled_text;

		srand(time(NULL));

		ulint nr_of_blocks = n/B;//total number of blocks in the text
		ulint sampled_n = n/(uint)log2(n);//expected size of sampled text
		ulint nr_of_sampled_blocks = sampled_n/B;//expected number of sampled blocks
		double p = (double)nr_of_sampled_blocks/(double)nr_of_blocks;//probability that a block is sampled

		int perc,last_perc=-1;
		if(verbose)
			cout << "  Sampling text ... " << endl;

		ulint pos = n-1;//current position in the text
		while(not bfr->begin()){

			if(((n-1)-pos)%B==0){

				if(pos+1 >= B ){//if there are at least B characters to be sampled

					if((n-1)-pos==0 or flip_coin(p)){//randomly decide if sample the block

						for(uint i=0;i<B;i++)	//sample B characters
							sampled_text.push_back( bfr->read() );

					}

				}

				perc = (100*((n-1)-pos))/n;

				if(perc>last_perc and (perc%5)==0 and verbose){
					cout << "  " << perc << "% done." << endl;
					last_perc=perc;
				}

			}

			bfr->read();//skip character on text
			pos--;

		}

		bfr->rewind();

		if(verbose)
			cout << "\n  Sampled text size = " << sampled_text.size() << endl;

		/*
		 * Extimate number of bits in memory for each context:
		 * O(sigma * log n) bits for each context.
		 *
		 * Structures in memory:
		 *
		 * vector<uint > prefix_nr;
		 * vector<vector<uint> > edges;
		 * CumulativeCounters * counters;
		 * DynamicString ** dynStrings;
		 * ulint * lengths;
		 *
		 */

		PartialSums sample_cumulative_counter = PartialSums(sigma,n);//sample of cumulative counter to extimate its memory consumption
		DynamicString<bitv> sample_dynstring = DynamicString<bitv>(vector<ulint>(sigma,1));

		ulint bits_per_k_mer =
				CHAR_BIT * sizeof(DynamicString<bitv> *) + //pointers to DynamicStrings
				sample_cumulative_counter.bitSize()  + //cumulative counters
				sample_dynstring.bitSize() + //DynamicStrings
				CHAR_BIT*sizeof(vector<uint >) + //vector prefix_nr
				CHAR_BIT*sizeof(uint) + //content of vector prefix_nr
				CHAR_BIT*sizeof(ulint); //lengths

		ulint bits_per_k_1_mer =
				CHAR_BIT*sizeof(vector<uint>) + //vector edges
				CHAR_BIT*sigma*sizeof(uint); //content of vector edges

		uint log_n = log2(n+1);

		if(verbose) cout << "  Extimated number of bits per k-mer: " << bits_per_k_mer << endl;
		if(verbose) cout << "  Extimated number of bits per (k-1)-mer: " << bits_per_k_1_mer << endl;

		ulint nr_of_k_mers;
		ulint nr_of_k_1_mers=1;//number of (k-1)-mers

		// we want the highest k such that nr_of_contexts*bits_per_context <= n * (overhead/100)

		uint _k = 1;//start from k=1.
		nr_of_k_mers=numberOfContexts( _k, sampled_text);

		if(verbose) cout << "  Number of " << _k << "-mers : " << nr_of_k_mers << endl;

		while( _k < log_n and (nr_of_k_mers * bits_per_k_mer + nr_of_k_1_mers * bits_per_k_1_mer <= (n * overhead)/100) ){

			_k++;

			nr_of_k_1_mers = nr_of_k_mers;
			nr_of_k_mers=numberOfContexts( _k, sampled_text);

			if(verbose) cout << "  Number of " << _k << "-mers : " << nr_of_k_mers << endl;

		}

		if(_k > 1)//we found the first _k above the threshold, so decrease _k.
			_k--;
		else
			_k = 1;//minimum k is 1

		return _k;

	}